

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void test_bitset_lenrange_cardinality(void)

{
  uint32_t uVar1;
  int iVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int k;
  uint32_t uVar3;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  local_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_68 = 0xffffffff;
  uStack_64 = 0xffffffff;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  uVar3 = 0;
  while (uVar3 != 0x100) {
    uVar1 = bitset_lenrange_cardinality((uint64_t *)&local_68,uVar3,(uint32_t)in_RDX);
    uVar3 = uVar3 + 1;
    _assert_true((ulong)(uVar3 == uVar1),"bitset_lenrange_cardinality(words, 0, k) == k + 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x25);
    in_RDX = extraout_RDX;
  }
  for (uVar3 = 0x100; uVar3 != 0x200; uVar3 = uVar3 + 1) {
    iVar2 = bitset_lenrange_cardinality((uint64_t *)&local_68,uVar3,(uint32_t)in_RDX);
    _assert_true((ulong)(iVar2 == 0x100),"bitset_lenrange_cardinality(words, 0, k) == 4 * 64",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x28);
    in_RDX = extraout_RDX_00;
  }
  return;
}

Assistant:

DEFINE_TEST(test_bitset_lenrange_cardinality) {
    uint64_t words[] = {
        ~UINT64_C(0), ~UINT64_C(0), ~UINT64_C(0), ~UINT64_C(0), 0, 0, 0, 0};
    for (int k = 0; k < 64 * 4; k++) {
        assert_true(bitset_lenrange_cardinality(words, 0, k) == k + 1);  // ok
    }
    for (int k = 64 * 4; k < 64 * 8; k++) {
        assert_true(bitset_lenrange_cardinality(words, 0, k) == 4 * 64);  // ok
    }
}